

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

bool google::protobuf::internal::TcParser::ChangeOneof
               (TcParseTableBase *table,FieldEntry *entry,uint32_t field_num,ParseContext *ctx,
               MessageLite *msg)

{
  ushort uVar1;
  uint32_t field_num_00;
  long *plVar2;
  Cord *this;
  uint32_t *puVar3;
  FieldEntry *pFVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  MicroString *this_00;
  string_view str;
  string_view str_00;
  LogMessage local_30;
  uint local_1c;
  
  puVar3 = (uint32_t *)((long)&msg->_vptr_MessageLite + (long)entry->has_idx);
  if (((ulong)puVar3 & 3) != 0) {
    AlignFail(puVar3);
  }
  field_num_00 = *puVar3;
  *puVar3 = field_num;
  bVar6 = true;
  if (field_num_00 != 0) {
    if (field_num_00 == field_num) {
      bVar6 = false;
    }
    else {
      pFVar4 = FindFieldEntry(table,field_num_00);
      uVar1 = pFVar4->type_card;
      if ((uVar1 & 7) == 6) {
        if ((uVar1 & 0x180) == 0) {
          this_00 = (MicroString *)((long)&msg->_vptr_MessageLite + (ulong)pFVar4->offset);
          if (((ulong)this_00 & 7) == 0) {
            uVar5 = (msg->_internal_metadata_).ptr_;
            if ((uVar5 & 1) != 0) {
              uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
            }
            if (uVar5 != 0) {
              return true;
            }
            plVar2 = (long *)((TaggedStringPtr *)&this_00->rep_)->ptr_;
            if (plVar2 == (long *)0x0) {
              return true;
            }
            (**(code **)(*plVar2 + 8))();
            return true;
          }
          goto LAB_002c2bde;
        }
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x746);
        str._M_str = "message rep not handled: ";
        str._M_len = 0x19;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_30,str);
        local_1c = (uVar1 & 0x1c0) >> 6;
        absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(&local_30,(int *)&local_1c)
        ;
      }
      else {
        if ((uVar1 & 7) != 5) {
          return true;
        }
        uVar7 = (uVar1 & 0x1c0) >> 6;
        if (uVar7 == 5) {
          uVar5 = (msg->_internal_metadata_).ptr_;
          if ((uVar5 & 1) != 0) {
            uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
          }
          if (uVar5 != 0) {
            return true;
          }
          this_00 = (MicroString *)((long)&msg->_vptr_MessageLite + (ulong)pFVar4->offset);
          if (((ulong)this_00 & 7) == 0) {
            if (((ulong)this_00->rep_ & 3) == 0) {
              return true;
            }
            MicroString::DestroySlow(this_00);
            return true;
          }
LAB_002c2bde:
          AlignFail(this_00);
        }
        if (uVar7 == 2) {
          uVar5 = (msg->_internal_metadata_).ptr_;
          if ((uVar5 & 1) != 0) {
            uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
          }
          if (uVar5 != 0) {
            return true;
          }
          this_00 = (MicroString *)((long)&msg->_vptr_MessageLite + (ulong)pFVar4->offset);
          if (((ulong)this_00 & 7) == 0) {
            this = (Cord *)((TaggedStringPtr *)&this_00->rep_)->ptr_;
            if (this != (Cord *)0x0) {
              absl::lts_20250127::Cord::~Cord(this);
            }
            operator_delete(this,0x10);
            return true;
          }
          goto LAB_002c2bde;
        }
        if ((uVar1 & 0x1c0) == 0) {
          this_00 = (MicroString *)((long)&msg->_vptr_MessageLite + (ulong)pFVar4->offset);
          if (((ulong)this_00 & 7) == 0) {
            ArenaStringPtr::Destroy((ArenaStringPtr *)this_00);
            return true;
          }
          goto LAB_002c2bde;
        }
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x737);
        str_00._M_str = "string rep not handled: ";
        str_00._M_len = 0x18;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_30,str_00);
        local_1c = uVar7;
        absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(&local_30,(int *)&local_1c)
        ;
      }
      absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_30);
    }
  }
  return bVar6;
}

Assistant:

bool TcParser::ChangeOneof(const TcParseTableBase* table,
                           const TcParseTableBase::FieldEntry& entry,
                           uint32_t field_num, ParseContext* ctx,
                           MessageLite* msg) {
  // The _oneof_case_ value offset is stored in the has-bit index.
  uint32_t* oneof_case = &TcParser::RefAt<uint32_t>(msg, entry.has_idx);
  uint32_t current_case = *oneof_case;
  *oneof_case = field_num;

  if (current_case == 0) {
    // If the member is empty, we don't have anything to clear. Caller is
    // responsible for creating a new member object.
    return true;
  }
  if (current_case == field_num) {
    // If the member is already active, then it should be merged. We're done.
    return false;
  }
  // Look up the value that is already stored, and dispose of it if necessary.
  const FieldEntry* current_entry = FindFieldEntry(table, current_case);
  uint16_t current_kind = current_entry->type_card & field_layout::kFkMask;
  uint16_t current_rep = current_entry->type_card & field_layout::kRepMask;
  if (current_kind == field_layout::kFkString) {
    switch (current_rep) {
      case field_layout::kRepAString: {
        auto& field = RefAt<ArenaStringPtr>(msg, current_entry->offset);
        field.Destroy();
        break;
      }
      case field_layout::kRepMString: {
        if (msg->GetArena() == nullptr) {
          RefAt<MicroString>(msg, current_entry->offset).Destroy();
        }
        break;
      }
      case field_layout::kRepCord: {
        if (msg->GetArena() == nullptr) {
          delete RefAt<absl::Cord*>(msg, current_entry->offset);
        }
        break;
      }
      case field_layout::kRepSString:
      case field_layout::kRepIString:
      default:
        ABSL_DLOG(FATAL) << "string rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        return true;
    }
  } else if (current_kind == field_layout::kFkMessage) {
    switch (current_rep) {
      case field_layout::kRepMessage:
      case field_layout::kRepGroup: {
        auto& field = RefAt<MessageLite*>(msg, current_entry->offset);
        if (!msg->GetArena()) {
          delete field;
        }
        break;
      }
      default:
        ABSL_DLOG(FATAL) << "message rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        break;
    }
  }
  return true;
}